

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3377::ProfileDataTest_StartResetRestart_Test::TestBody
          (ProfileDataTest_StartResetRestart_Test *this)

{
  ProfileData *this_00;
  Options *this_01;
  __ino_t *p_Var1;
  pointer pcVar2;
  bool bVar3;
  char *in_R9;
  pointer *__ptr;
  char *pcVar4;
  undefined1 local_148 [8];
  stat statbuf;
  Options options;
  Message MStack_a8;
  ProfileDataSlot slots [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  AssertHelper local_48;
  AssertHelper local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  ProfileDataTest::ExpectStopped
            ((ProfileDataTest *)(ulong)(uint)(this->super_ProfileDataTest).collector_.out_);
  this_01 = (Options *)((long)statbuf.__glibc_reserved + 0x14);
  ProfileData::Options::Options(this_01);
  statbuf.__glibc_reserved[2]._4_4_ = 1;
  this_00 = &(this->super_ProfileDataTest).collector_;
  pcVar2 = (this->super_ProfileDataTest).checker_.filename_._M_dataplus._M_p;
  p_Var1 = &statbuf.st_ino;
  local_148 = (undefined1  [8])p_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_148,pcVar2,
             pcVar2 + (this->super_ProfileDataTest).checker_.filename_._M_string_length);
  bVar3 = ProfileData::Start(this_00,(char *)local_148,this_01);
  MStack_a8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)bVar3;
  slots[0] = 0;
  if (local_148 == (undefined1  [8])p_Var1) {
    if (!bVar3) goto LAB_0010dc6a;
  }
  else {
    operator_delete((void *)local_148,statbuf.st_ino + 1);
    if (((ulong)MStack_a8.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl & 1) == 0) {
LAB_0010dc6a:
      testing::Message::Message((Message *)(slots + 7));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_148,(internal *)&MStack_a8,
                 (AssertionResult *)"collector_.Start(checker_.filename().c_str(), options)","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
                 ,0x21c,(char *)local_148);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)(slots + 7));
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_148 != (undefined1  [8])p_Var1) {
        operator_delete((void *)local_148,statbuf.st_ino + 1);
      }
      if (slots[7] != 0) {
        (**(code **)(*(long *)slots[7] + 8))();
      }
    }
  }
  if (slots[0] != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)slots,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          slots[0]);
  }
  ProfileDataTest::ExpectRunningSamples(&this->super_ProfileDataTest,0);
  ProfileData::Reset(this_00);
  ProfileDataTest::ExpectStopped
            ((ProfileDataTest *)(ulong)(uint)(this->super_ProfileDataTest).collector_.out_);
  (anonymous_namespace)::ProfileDataChecker::ValidateProfile_abi_cxx11_
            ((string *)local_148,(this->super_ProfileDataTest).checker_.filename_._M_dataplus._M_p);
  pcVar4 = "";
  testing::internal::CmpHelperNE<char[1],std::__cxx11::string>
            ((internal *)&MStack_a8,"kNoError","checker_.ValidateProfile()",(char (*) [1])"",
             (string *)local_148);
  if (local_148 != (undefined1  [8])p_Var1) {
    operator_delete((void *)local_148,statbuf.st_ino + 1);
  }
  if (MStack_a8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_148);
    if (slots[0] != 0) {
      pcVar4 = *(char **)slots[0];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(slots + 7),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x222,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)(slots + 7),(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(slots + 7));
    if (local_148 != (undefined1  [8])0x0) {
      (**(code **)(*(__ino_t *)local_148 + 8))();
    }
  }
  if (slots[0] != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)slots,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          slots[0]);
  }
  local_40.data_._0_4_ = 0;
  pcVar2 = (this->super_ProfileDataTest).checker_.filename_._M_dataplus._M_p;
  MStack_a8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(slots + 1);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&MStack_a8,pcVar2,
             pcVar2 + (this->super_ProfileDataTest).checker_.filename_._M_string_length);
  local_48.data_._0_4_ =
       stat((char *)MStack_a8.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl,(stat *)local_148);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)(slots + 7),"0","stat(checker_.filename().c_str(), &statbuf)",
             (int *)&local_40,(int *)&local_48);
  if (MStack_a8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )(slots + 1)) {
    operator_delete((void *)MStack_a8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl,slots[1] + 1);
  }
  if ((char)slots[7] == '\0') {
    testing::Message::Message(&MStack_a8);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x225,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,&MStack_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (MStack_a8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(ProfileDataSlot *)
                    MStack_a8.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
  slots[7] = (ulong)slots[7]._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&MStack_a8,"0","statbuf.st_size",(int *)(slots + 7),
             (long *)&statbuf.st_rdev);
  if (MStack_a8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)(slots + 7));
    if (slots[0] == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)slots[0];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x226,pcVar4);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)(slots + 7));
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (slots[7] != 0) {
      (**(code **)(*(long *)slots[7] + 8))();
    }
  }
  if (slots[0] != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)slots,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          slots[0]);
  }
  MStack_a8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
  slots[1] = 0;
  slots[6] = 0;
  slots[3] = 0;
  slots[4] = 0;
  slots[0] = 3;
  slots[2] = 500000;
  slots[5] = 1;
  statbuf.__glibc_reserved[2]._4_4_ = 2;
  pcVar2 = (this->super_ProfileDataTest).checker_.filename_._M_dataplus._M_p;
  slots[7] = (ProfileDataSlot)&local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(slots + 7),pcVar2,
             pcVar2 + (this->super_ProfileDataTest).checker_.filename_._M_string_length);
  bVar3 = ProfileData::Start(this_00,(char *)slots[7],
                             (Options *)((long)statbuf.__glibc_reserved + 0x14));
  local_40.data_._0_4_ = CONCAT31(local_40.data_._1_3_,bVar3);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)slots[7] == &local_58) {
    if (bVar3) goto LAB_0010e0d8;
  }
  else {
    operator_delete((void *)slots[7],local_58._M_allocated_capacity + 1);
    if (((uint)local_40.data_ & 1) != 0) goto LAB_0010e0d8;
  }
  testing::Message::Message((Message *)&local_48);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)(slots + 7),(internal *)&local_40,
             (AssertionResult *)"collector_.Start(checker_.filename().c_str(), options)","false",
             "true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
             ,0x22f,(char *)slots[7]);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&local_48);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)slots[7] != &local_58) {
    operator_delete((void *)slots[7],local_58._M_allocated_capacity + 1);
  }
  if ((long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) + 8))();
  }
LAB_0010e0d8:
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  ProfileDataTest::ExpectRunningSamples(&this->super_ProfileDataTest,0);
  ProfileData::Stop(this_00);
  ProfileDataTest::ExpectStopped
            ((ProfileDataTest *)(ulong)(uint)(this->super_ProfileDataTest).collector_.out_);
  (anonymous_namespace)::ProfileDataChecker::ValidateProfile_abi_cxx11_
            ((string *)(slots + 7),(this->super_ProfileDataTest).checker_.filename_._M_dataplus._M_p
            );
  pcVar4 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_40,"kNoError","checker_.ValidateProfile()",(char (*) [1])"",
             (string *)(slots + 7));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)slots[7] != &local_58) {
    operator_delete((void *)slots[7],local_58._M_allocated_capacity + 1);
  }
  if (local_40.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)(slots + 7));
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x233,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)(slots + 7));
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (slots[7] != 0) {
      (**(code **)(*(long *)slots[7] + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  (anonymous_namespace)::ProfileDataChecker::CheckWithSkips_abi_cxx11_
            ((string *)(slots + 7),(this->super_ProfileDataTest).checker_.filename_._M_dataplus._M_p
             ,(ProfileDataSlot *)&MStack_a8,8,(int *)0x0,0);
  pcVar4 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_40,"kNoError",
             "checker_.Check(slots, (sizeof(slots) / sizeof(*(slots))))",(char (*) [1])"",
             (string *)(slots + 7));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)slots[7] != &local_58) {
    operator_delete((void *)slots[7],local_58._M_allocated_capacity + 1);
  }
  if (local_40.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)(slots + 7));
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x234,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)(slots + 7));
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (slots[7] != 0) {
      (**(code **)(*(long *)slots[7] + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TEST_F(ProfileDataTest, StartResetRestart) {
  ExpectStopped();
  ProfileData::Options options;
  options.set_frequency(1);
  EXPECT_TRUE(collector_.Start(checker_.filename().c_str(), options));
  ExpectRunningSamples(0);
  collector_.Reset();
  ExpectStopped();
  // We expect the resulting file to be empty.  This is a minimal test
  // of ValidateProfile.
  EXPECT_NE(kNoError, checker_.ValidateProfile());

  struct stat statbuf;
  EXPECT_EQ(0, stat(checker_.filename().c_str(), &statbuf));
  EXPECT_EQ(0, statbuf.st_size);

  const int frequency = 2;  // Different frequency than used above.
  ProfileDataSlot slots[] = {
    0, 3, 0, 1000000 / frequency, 0,    // binary header
    0, 1, 0                             // binary trailer
  };

  options.set_frequency(frequency);
  EXPECT_TRUE(collector_.Start(checker_.filename().c_str(), options));
  ExpectRunningSamples(0);
  collector_.Stop();
  ExpectStopped();
  EXPECT_EQ(kNoError, checker_.ValidateProfile());
  EXPECT_EQ(kNoError, checker_.Check(slots, arraysize(slots)));
}